

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O1

void __thiscall btCollisionWorldImporter::deleteAllData(btCollisionWorldImporter *this)

{
  btCollisionWorld *pbVar1;
  btCollisionObject *pbVar2;
  btCollisionObject **ptr;
  btCollisionShape *pbVar3;
  btCollisionShape **ptr_00;
  btOptimizedBvh *pbVar4;
  btOptimizedBvh **ptr_01;
  btTriangleInfoMap *pbVar5;
  btTriangleInfoMap **ptr_02;
  btTriangleIndexVertexArray *pbVar6;
  btTriangleIndexVertexArray **ptr_03;
  char *pcVar7;
  char **ptr_04;
  btStridingMeshInterfaceData *pbVar8;
  btMeshPartData *pbVar9;
  void *pvVar10;
  btStridingMeshInterfaceData **ptr_05;
  int **ptr_06;
  short **ptr_07;
  uchar **ptr_08;
  btVector3FloatData **ptr_09;
  btVector3DoubleData **ptr_10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  if (0 < (this->m_allocatedCollisionObjects).m_size) {
    lVar13 = 0;
    do {
      pbVar1 = this->m_collisionWorld;
      if (pbVar1 != (btCollisionWorld *)0x0) {
        (*pbVar1->_vptr_btCollisionWorld[10])
                  (pbVar1,(this->m_allocatedCollisionObjects).m_data[lVar13]);
      }
      pbVar2 = (this->m_allocatedCollisionObjects).m_data[lVar13];
      if (pbVar2 != (btCollisionObject *)0x0) {
        (*pbVar2->_vptr_btCollisionObject[1])();
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_allocatedCollisionObjects).m_size);
  }
  ptr = (this->m_allocatedCollisionObjects).m_data;
  if (ptr != (btCollisionObject **)0x0) {
    if ((this->m_allocatedCollisionObjects).m_ownsMemory == true) {
      btAlignedFreeInternal(ptr);
    }
    (this->m_allocatedCollisionObjects).m_data = (btCollisionObject **)0x0;
  }
  (this->m_allocatedCollisionObjects).m_ownsMemory = true;
  (this->m_allocatedCollisionObjects).m_data = (btCollisionObject **)0x0;
  (this->m_allocatedCollisionObjects).m_size = 0;
  (this->m_allocatedCollisionObjects).m_capacity = 0;
  if (0 < (this->m_allocatedCollisionShapes).m_size) {
    lVar13 = 0;
    do {
      pbVar3 = (this->m_allocatedCollisionShapes).m_data[lVar13];
      if (pbVar3 != (btCollisionShape *)0x0) {
        (*pbVar3->_vptr_btCollisionShape[1])();
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_allocatedCollisionShapes).m_size);
  }
  ptr_00 = (this->m_allocatedCollisionShapes).m_data;
  if (ptr_00 != (btCollisionShape **)0x0) {
    if ((this->m_allocatedCollisionShapes).m_ownsMemory == true) {
      btAlignedFreeInternal(ptr_00);
    }
    (this->m_allocatedCollisionShapes).m_data = (btCollisionShape **)0x0;
  }
  (this->m_allocatedCollisionShapes).m_ownsMemory = true;
  (this->m_allocatedCollisionShapes).m_data = (btCollisionShape **)0x0;
  (this->m_allocatedCollisionShapes).m_size = 0;
  (this->m_allocatedCollisionShapes).m_capacity = 0;
  if (0 < (this->m_allocatedBvhs).m_size) {
    lVar13 = 0;
    do {
      pbVar4 = (this->m_allocatedBvhs).m_data[lVar13];
      if (pbVar4 != (btOptimizedBvh *)0x0) {
        (*(pbVar4->super_btQuantizedBvh)._vptr_btQuantizedBvh[1])();
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_allocatedBvhs).m_size);
  }
  ptr_01 = (this->m_allocatedBvhs).m_data;
  if (ptr_01 != (btOptimizedBvh **)0x0) {
    if ((this->m_allocatedBvhs).m_ownsMemory == true) {
      btAlignedFreeInternal(ptr_01);
    }
    (this->m_allocatedBvhs).m_data = (btOptimizedBvh **)0x0;
  }
  (this->m_allocatedBvhs).m_ownsMemory = true;
  (this->m_allocatedBvhs).m_data = (btOptimizedBvh **)0x0;
  (this->m_allocatedBvhs).m_size = 0;
  (this->m_allocatedBvhs).m_capacity = 0;
  if (0 < (this->m_allocatedTriangleInfoMaps).m_size) {
    lVar13 = 0;
    do {
      pbVar5 = (this->m_allocatedTriangleInfoMaps).m_data[lVar13];
      if (pbVar5 != (btTriangleInfoMap *)0x0) {
        (*pbVar5->_vptr_btTriangleInfoMap[1])();
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_allocatedTriangleInfoMaps).m_size);
  }
  ptr_02 = (this->m_allocatedTriangleInfoMaps).m_data;
  if (ptr_02 != (btTriangleInfoMap **)0x0) {
    if ((this->m_allocatedTriangleInfoMaps).m_ownsMemory == true) {
      btAlignedFreeInternal(ptr_02);
    }
    (this->m_allocatedTriangleInfoMaps).m_data = (btTriangleInfoMap **)0x0;
  }
  (this->m_allocatedTriangleInfoMaps).m_ownsMemory = true;
  (this->m_allocatedTriangleInfoMaps).m_data = (btTriangleInfoMap **)0x0;
  (this->m_allocatedTriangleInfoMaps).m_size = 0;
  (this->m_allocatedTriangleInfoMaps).m_capacity = 0;
  if (0 < (this->m_allocatedTriangleIndexArrays).m_size) {
    lVar13 = 0;
    do {
      pbVar6 = (this->m_allocatedTriangleIndexArrays).m_data[lVar13];
      if (pbVar6 != (btTriangleIndexVertexArray *)0x0) {
        (*(pbVar6->super_btStridingMeshInterface)._vptr_btStridingMeshInterface[1])();
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_allocatedTriangleIndexArrays).m_size);
  }
  ptr_03 = (this->m_allocatedTriangleIndexArrays).m_data;
  if (ptr_03 != (btTriangleIndexVertexArray **)0x0) {
    if ((this->m_allocatedTriangleIndexArrays).m_ownsMemory == true) {
      btAlignedFreeInternal(ptr_03);
    }
    (this->m_allocatedTriangleIndexArrays).m_data = (btTriangleIndexVertexArray **)0x0;
  }
  (this->m_allocatedTriangleIndexArrays).m_ownsMemory = true;
  (this->m_allocatedTriangleIndexArrays).m_data = (btTriangleIndexVertexArray **)0x0;
  (this->m_allocatedTriangleIndexArrays).m_size = 0;
  (this->m_allocatedTriangleIndexArrays).m_capacity = 0;
  if (0 < (this->m_allocatedNames).m_size) {
    lVar13 = 0;
    do {
      pcVar7 = (this->m_allocatedNames).m_data[lVar13];
      if (pcVar7 != (char *)0x0) {
        operator_delete__(pcVar7);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_allocatedNames).m_size);
  }
  ptr_04 = (this->m_allocatedNames).m_data;
  if (ptr_04 != (char **)0x0) {
    if ((this->m_allocatedNames).m_ownsMemory == true) {
      btAlignedFreeInternal(ptr_04);
    }
    (this->m_allocatedNames).m_data = (char **)0x0;
  }
  (this->m_allocatedNames).m_ownsMemory = true;
  (this->m_allocatedNames).m_data = (char **)0x0;
  (this->m_allocatedNames).m_size = 0;
  (this->m_allocatedNames).m_capacity = 0;
  if (0 < (this->m_allocatedbtStridingMeshInterfaceDatas).m_size) {
    lVar13 = 0;
    do {
      pbVar8 = (this->m_allocatedbtStridingMeshInterfaceDatas).m_data[lVar13];
      if (0 < pbVar8->m_numMeshParts) {
        lVar11 = 0x28;
        lVar12 = 0;
        do {
          pbVar9 = pbVar8->m_meshPartsPtr;
          pvVar10 = *(void **)((long)pbVar9 + lVar11 + -0x28);
          if (pvVar10 != (void *)0x0) {
            operator_delete__(pvVar10);
          }
          pvVar10 = *(void **)((long)pbVar9 + lVar11 + -0x20);
          if (pvVar10 != (void *)0x0) {
            operator_delete__(pvVar10);
          }
          pvVar10 = *(void **)((long)pbVar9 + lVar11 + -0x18);
          if (pvVar10 != (void *)0x0) {
            operator_delete__(pvVar10);
          }
          pvVar10 = *(void **)((long)pbVar9 + lVar11 + -0x10);
          if (pvVar10 != (void *)0x0) {
            operator_delete__(pvVar10);
          }
          pvVar10 = *(void **)((long)&pbVar9->m_vertices3f + lVar11);
          if (pvVar10 != (void *)0x0) {
            operator_delete__(pvVar10);
          }
          pvVar10 = *(void **)((long)pbVar9 + lVar11 + -8);
          if (pvVar10 != (void *)0x0) {
            operator_delete__(pvVar10);
          }
          lVar12 = lVar12 + 1;
          lVar11 = lVar11 + 0x38;
        } while (lVar12 < pbVar8->m_numMeshParts);
      }
      if (pbVar8->m_meshPartsPtr != (btMeshPartData *)0x0) {
        operator_delete__(pbVar8->m_meshPartsPtr);
      }
      operator_delete(pbVar8);
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_allocatedbtStridingMeshInterfaceDatas).m_size);
  }
  ptr_05 = (this->m_allocatedbtStridingMeshInterfaceDatas).m_data;
  if (ptr_05 != (btStridingMeshInterfaceData **)0x0) {
    if ((this->m_allocatedbtStridingMeshInterfaceDatas).m_ownsMemory == true) {
      btAlignedFreeInternal(ptr_05);
    }
    (this->m_allocatedbtStridingMeshInterfaceDatas).m_data = (btStridingMeshInterfaceData **)0x0;
  }
  (this->m_allocatedbtStridingMeshInterfaceDatas).m_ownsMemory = true;
  (this->m_allocatedbtStridingMeshInterfaceDatas).m_data = (btStridingMeshInterfaceData **)0x0;
  (this->m_allocatedbtStridingMeshInterfaceDatas).m_size = 0;
  (this->m_allocatedbtStridingMeshInterfaceDatas).m_capacity = 0;
  if (0 < (this->m_indexArrays).m_size) {
    lVar13 = 0;
    do {
      btAlignedFreeInternal((this->m_indexArrays).m_data[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_indexArrays).m_size);
  }
  ptr_06 = (this->m_indexArrays).m_data;
  if (ptr_06 != (int **)0x0) {
    if ((this->m_indexArrays).m_ownsMemory == true) {
      btAlignedFreeInternal(ptr_06);
    }
    (this->m_indexArrays).m_data = (int **)0x0;
  }
  (this->m_indexArrays).m_ownsMemory = true;
  (this->m_indexArrays).m_data = (int **)0x0;
  (this->m_indexArrays).m_size = 0;
  (this->m_indexArrays).m_capacity = 0;
  if (0 < (this->m_shortIndexArrays).m_size) {
    lVar13 = 0;
    do {
      btAlignedFreeInternal((this->m_shortIndexArrays).m_data[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_shortIndexArrays).m_size);
  }
  ptr_07 = (this->m_shortIndexArrays).m_data;
  if (ptr_07 != (short **)0x0) {
    if ((this->m_shortIndexArrays).m_ownsMemory == true) {
      btAlignedFreeInternal(ptr_07);
    }
    (this->m_shortIndexArrays).m_data = (short **)0x0;
  }
  (this->m_shortIndexArrays).m_ownsMemory = true;
  (this->m_shortIndexArrays).m_data = (short **)0x0;
  (this->m_shortIndexArrays).m_size = 0;
  (this->m_shortIndexArrays).m_capacity = 0;
  if (0 < (this->m_charIndexArrays).m_size) {
    lVar13 = 0;
    do {
      btAlignedFreeInternal((this->m_charIndexArrays).m_data[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_charIndexArrays).m_size);
  }
  ptr_08 = (this->m_charIndexArrays).m_data;
  if (ptr_08 != (uchar **)0x0) {
    if ((this->m_charIndexArrays).m_ownsMemory == true) {
      btAlignedFreeInternal(ptr_08);
    }
    (this->m_charIndexArrays).m_data = (uchar **)0x0;
  }
  (this->m_charIndexArrays).m_ownsMemory = true;
  (this->m_charIndexArrays).m_data = (uchar **)0x0;
  (this->m_charIndexArrays).m_size = 0;
  (this->m_charIndexArrays).m_capacity = 0;
  if (0 < (this->m_floatVertexArrays).m_size) {
    lVar13 = 0;
    do {
      btAlignedFreeInternal((this->m_floatVertexArrays).m_data[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_floatVertexArrays).m_size);
  }
  ptr_09 = (this->m_floatVertexArrays).m_data;
  if (ptr_09 != (btVector3FloatData **)0x0) {
    if ((this->m_floatVertexArrays).m_ownsMemory == true) {
      btAlignedFreeInternal(ptr_09);
    }
    (this->m_floatVertexArrays).m_data = (btVector3FloatData **)0x0;
  }
  (this->m_floatVertexArrays).m_ownsMemory = true;
  (this->m_floatVertexArrays).m_data = (btVector3FloatData **)0x0;
  (this->m_floatVertexArrays).m_size = 0;
  (this->m_floatVertexArrays).m_capacity = 0;
  if (0 < (this->m_doubleVertexArrays).m_size) {
    lVar13 = 0;
    do {
      btAlignedFreeInternal((this->m_doubleVertexArrays).m_data[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < (this->m_doubleVertexArrays).m_size);
  }
  ptr_10 = (this->m_doubleVertexArrays).m_data;
  if (ptr_10 != (btVector3DoubleData **)0x0) {
    if ((this->m_doubleVertexArrays).m_ownsMemory == true) {
      btAlignedFreeInternal(ptr_10);
    }
    (this->m_doubleVertexArrays).m_data = (btVector3DoubleData **)0x0;
  }
  (this->m_doubleVertexArrays).m_ownsMemory = true;
  (this->m_doubleVertexArrays).m_data = (btVector3DoubleData **)0x0;
  (this->m_doubleVertexArrays).m_size = 0;
  (this->m_doubleVertexArrays).m_capacity = 0;
  return;
}

Assistant:

void btCollisionWorldImporter::deleteAllData()
{
	int i;

	for (i=0;i<m_allocatedCollisionObjects.size();i++)
	{
		if(m_collisionWorld)
			m_collisionWorld->removeCollisionObject(m_allocatedCollisionObjects[i]);
		delete m_allocatedCollisionObjects[i];
	}

	m_allocatedCollisionObjects.clear();


	for (i=0;i<m_allocatedCollisionShapes.size();i++)
	{
		delete m_allocatedCollisionShapes[i];
	}
	m_allocatedCollisionShapes.clear();


	for (i=0;i<m_allocatedBvhs.size();i++)
	{
		delete m_allocatedBvhs[i];
	}
	m_allocatedBvhs.clear();

	for (i=0;i<m_allocatedTriangleInfoMaps.size();i++)
	{
		delete m_allocatedTriangleInfoMaps[i];
	}
	m_allocatedTriangleInfoMaps.clear();
	for (i=0;i<m_allocatedTriangleIndexArrays.size();i++)
	{
		delete m_allocatedTriangleIndexArrays[i];
	}
	m_allocatedTriangleIndexArrays.clear();
	for (i=0;i<m_allocatedNames.size();i++)
	{
		delete[] m_allocatedNames[i];
	}
	m_allocatedNames.clear();

	for (i=0;i<m_allocatedbtStridingMeshInterfaceDatas.size();i++)
	{
		btStridingMeshInterfaceData* curData = m_allocatedbtStridingMeshInterfaceDatas[i];

		for(int a = 0;a < curData->m_numMeshParts;a++)
		{
			btMeshPartData* curPart = &curData->m_meshPartsPtr[a];
			if(curPart->m_vertices3f)
				delete [] curPart->m_vertices3f;

			if(curPart->m_vertices3d)
				delete [] curPart->m_vertices3d;

			if(curPart->m_indices32)
				delete [] curPart->m_indices32;

			if(curPart->m_3indices16)
				delete [] curPart->m_3indices16;

			if(curPart->m_indices16)
				delete [] curPart->m_indices16;

			if (curPart->m_3indices8)
				delete [] curPart->m_3indices8;

		}
		delete [] curData->m_meshPartsPtr;
		delete curData;
	}
	m_allocatedbtStridingMeshInterfaceDatas.clear();

	for (i=0;i<m_indexArrays.size();i++)
	{
		btAlignedFree(m_indexArrays[i]);
	}
  m_indexArrays.clear();

	for (i=0;i<m_shortIndexArrays.size();i++)
	{
		btAlignedFree(m_shortIndexArrays[i]);
	}
  m_shortIndexArrays.clear();

	for (i=0;i<m_charIndexArrays.size();i++)
	{
		btAlignedFree(m_charIndexArrays[i]);
	}
  m_charIndexArrays.clear();

	for (i=0;i<m_floatVertexArrays.size();i++)
	{
		btAlignedFree(m_floatVertexArrays[i]);
	}
  m_floatVertexArrays.clear();

	for (i=0;i<m_doubleVertexArrays.size();i++)
	{
		btAlignedFree(m_doubleVertexArrays[i]);
	}
   m_doubleVertexArrays.clear();


}